

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void __thiscall
mxx::custom_op<float,true>::custom_op<float_const&(*)(float_const&,float_const&)>
          (custom_op<float,true> *this,_func_float_ptr_float_ptr_float_ptr *func)

{
  undefined *puVar1;
  datatype dt;
  int local_24;
  
  *(undefined ***)this = &PTR__custom_op_001ab878;
  puVar1 = &ompi_mpi_op_null;
  if (func == std::max<float>) {
    puVar1 = &ompi_mpi_op_max;
  }
  if (func == std::min<float>) {
    puVar1 = &ompi_mpi_op_min;
  }
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  this[0x28] = (custom_op<float,true>)0x0;
  if (puVar1 != &ompi_mpi_op_null) {
    this[0x28] = (custom_op<float,true>)0x1;
    *(undefined **)(this + 0x38) = puVar1;
    dt._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
    dt.mpitype = (MPI_Datatype)&ompi_mpi_float;
    dt.builtin = true;
    *(undefined **)(this + 0x30) = &ompi_mpi_float;
    datatype::~datatype(&dt);
    if (((byte)this[0x28] & 1) != 0) {
      return;
    }
  }
  dt._vptr_datatype = (_func_int **)custom_function<float_const&(*)(float_const&,float_const&)>;
  dt.mpitype = (MPI_Datatype)func;
  std::function<void(void*,void*,int*)>::operator=
            ((function<void(void*,void*,int*)> *)(this + 8),
             (_Bind<void_(*(const_float_&(*)(const_float_&,_const_float_&),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_float_&(*)(const_float_&,_const_float_&),_void_*,_void_*,_int_*)>
              *)&dt);
  dt._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
  dt.mpitype = (MPI_Datatype)&ompi_mpi_float;
  dt.builtin = true;
  MPI_Type_dup(&ompi_mpi_float,this + 0x30);
  local_24 = 0x543;
  attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::set
            ((MPI_Datatype *)(this + 0x30),&local_24,
             (function<void_(void_*,_void_*,_int_*)> *)(this + 8));
  MPI_Op_create(custom_op<float,_true>::mpi_user_function,1,this + 0x38);
  datatype::~datatype(&dt);
  return;
}

Assistant:

custom_op(Func func) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            using namespace std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                  std::forward<Func>(func), _1, _2, _3);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, IsCommutative, &m_op);
        }
    }